

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfMapNamedBufferRange(ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  deUint32 dVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  undefined4 *puVar14;
  void *pvVar15;
  GLvoid *mapped_data_8;
  GLuint i_1;
  GLuint flags_count;
  GLchar *mapping_flags_log [4];
  GLenum mapping_flags [4];
  GLenum buffer_flags [4];
  GLvoid *mapped_data_7;
  GLvoid *mapped_data_6;
  GLuint i;
  GLuint read_access_invalid_flags_count;
  GLchar *read_access_invalid_flags_log [3];
  GLenum read_access_invalid_flags [3];
  GLvoid *mapped_data_5;
  void *local_68;
  GLvoid *subsequent_mapped_data;
  GLvoid *mapped_data_4;
  GLvoid *mapped_data_3;
  GLvoid *mapped_data_2;
  GLvoid *mapped_data_1;
  GLvoid *mapped_data;
  GLuint not_a_buffer_name;
  undefined4 local_28;
  GLuint local_24;
  GLubyte dummy_data [4];
  GLuint buffer_special_flags;
  GLuint buffer;
  bool internal_error;
  bool is_ok;
  Functions *gl;
  ErrorsTest *this_local;
  long lVar13;
  
  pRVar12 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar10 = (*pRVar12->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar10);
  dummy_data[0] = '\0';
  dummy_data[1] = '\0';
  dummy_data[2] = '\0';
  dummy_data[3] = '\0';
  local_24 = 0;
  local_28 = 0;
  (**(code **)(lVar13 + 0x3b8))(1,dummy_data);
  dVar11 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar11,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1026);
  (*this->m_pNamedBufferStorage)((GLuint)dummy_data,4,&local_28,0x43);
  dVar11 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar11,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x102a);
  mapped_data._0_4_ = 0;
  do {
    mapped_data._0_4_ = (GLuint)mapped_data + 1;
    cVar1 = (**(code **)(lVar13 + 0xc68))();
  } while (cVar1 != '\0');
  (*this->m_pMapNamedBufferRange)((GLuint)mapped_data,0,4,1);
  bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                           " if buffer is not the name of an existing buffer object.");
  mapped_data_1 = (*this->m_pMapNamedBufferRange)((GLuint)dummy_data,-1,4,1);
  bVar3 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x501," if offset is negative.");
  if (mapped_data_1 != (GLvoid *)0x0) {
    (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
    do {
      iVar10 = (**(code **)(lVar13 + 0x800))();
    } while (iVar10 != 0);
  }
  mapped_data_2 = (*this->m_pMapNamedBufferRange)((GLuint)dummy_data,0,-1,1);
  bVar4 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x501," if length is negative.");
  if (mapped_data_2 != (GLvoid *)0x0) {
    (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
    do {
      iVar10 = (**(code **)(lVar13 + 0x800))();
    } while (iVar10 != 0);
  }
  mapped_data_3 = (*this->m_pMapNamedBufferRange)((GLuint)dummy_data,0,8,1);
  bVar5 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x501,
                           " if length is greater than the value of BUFFER_SIZE for the buffer object, or if access has any bits set other than those defined above."
                          );
  if (mapped_data_3 != (GLvoid *)0x0) {
    (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
    do {
      iVar10 = (**(code **)(lVar13 + 0x800))();
    } while (iVar10 != 0);
  }
  mapped_data_4 = (*this->m_pMapNamedBufferRange)((GLuint)dummy_data,2,4,1);
  bVar6 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x501,
                           " if offset+length is greater than the value of BUFFER_SIZE for the buffer object, or if access has any bits set other than those defined above."
                          );
  if (mapped_data_4 != (GLvoid *)0x0) {
    (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
    do {
      iVar10 = (**(code **)(lVar13 + 0x800))();
    } while (iVar10 != 0);
  }
  subsequent_mapped_data = (*this->m_pMapNamedBufferRange)((GLuint)dummy_data,0,0,1);
  bVar7 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502," if length is zero.");
  if (subsequent_mapped_data != (GLvoid *)0x0) {
    (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
    do {
      iVar10 = (**(code **)(lVar13 + 0x800))();
    } while (iVar10 != 0);
  }
  (*this->m_pMapNamedBufferRange)((GLuint)dummy_data,0,4,1);
  dVar11 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar11,"glMapNamedBuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1090);
  local_68 = (*this->m_pMapNamedBufferRange)((GLuint)dummy_data,0,4,1);
  bVar8 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                           " if the buffer object is in a mapped state.");
  (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
  dVar11 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar11,"glUnmapNamedBuffer failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x1099);
  if (local_68 != (void *)0x0) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&mapped_data_5,this_01,(BeginMessageToken *)&tcu::TestLog::Message)
    ;
    this_02 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&mapped_data_5,
                         (char (*) [213])
                         "glMapNamedBufferRange called on mapped buffer returned non-NULL pointer when error shall occure.This may lead to undefined behavior during next tests (object still may be mapped). Test was terminated prematurely."
                        );
    tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&mapped_data_5);
    puVar14 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar14 = 0;
    __cxa_throw(puVar14,&int::typeinfo,0);
  }
  pvVar15 = (*this->m_pMapNamedBufferRange)((GLuint)dummy_data,0,4,0);
  bVar9 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                           " if neither MAP_READ_BIT nor MAP_WRITE_BIT is set.");
  buffer_special_flags._3_1_ =
       (bVar8 && (((((bVar2 && bVar3) && bVar4) && bVar5) && bVar6) && bVar7)) && bVar9;
  if (pvVar15 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
    do {
      iVar10 = (**(code **)(lVar13 + 0x800))();
    } while (iVar10 != 0);
  }
  stack0xfffffffffffffe04 = 0x800000004;
  _i = " if MAP_READ_BIT is set with MAP_INVALIDATE_RANGE_BIT.";
  read_access_invalid_flags_log[0] = " if MAP_READ_BIT is set with MAP_INVALIDATE_BUFFER_BIT.";
  read_access_invalid_flags_log[1] = " if MAP_READ_BIT is set with MAP_UNSYNCHRONIZED_BIT.";
  for (mapped_data_6._0_4_ = 0; (uint)mapped_data_6 < 3;
      mapped_data_6._0_4_ = (uint)mapped_data_6 + 1) {
    pvVar15 = (*this->m_pMapNamedBufferRange)
                        ((GLuint)dummy_data,0,4,
                         *(uint *)((long)read_access_invalid_flags_log +
                                  (ulong)(uint)mapped_data_6 * 4 + 0x14) | 1);
    bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                             *(GLchar **)(&i + (ulong)(uint)mapped_data_6 * 2));
    buffer_special_flags._3_1_ = (buffer_special_flags._3_1_ & bVar2) != 0;
    if (pvVar15 != (void *)0x0) {
      (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
      do {
        iVar10 = (**(code **)(lVar13 + 0x800))();
      } while (iVar10 != 0);
    }
  }
  pvVar15 = (*this->m_pMapNamedBufferRange)((GLuint)dummy_data,0,4,0x11);
  bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                           " if MAP_FLUSH_EXPLICIT_BIT is set and MAP_WRITE_BIT is not set.");
  bVar2 = (bool)(buffer_special_flags._3_1_ & bVar2);
  if (pvVar15 != (void *)0x0) {
    (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
    do {
      iVar10 = (**(code **)(lVar13 + 0x800))();
    } while (iVar10 != 0);
  }
  mapping_flags[2] = 2;
  mapping_flags[3] = 1;
  mapping_flags_log[3] = (GLchar *)0x200000001;
  mapping_flags[0] = 0x42;
  mapping_flags[1] = 0xc2;
  _i_1 = " if MAP_READ_BIT is set, but the same bit is not included in the buffer\'s storage flags."
  ;
  mapping_flags_log[0] =
       " if MAP_WRITE_BIT is set, but the same bit is not included in the buffer\'s storage flags.";
  mapping_flags_log[1] =
       " if MAP_PERSISTENT_BIT is set, but the same bit is not included in the buffer\'s storage flags."
  ;
  mapping_flags_log[2] =
       " if MAP_COHERENT_BIT is set, but the same bit is not included in the buffer\'s storage flags."
  ;
  for (mapped_data_8._0_4_ = 0; buffer_special_flags._3_1_ = bVar2 != false, (uint)mapped_data_8 < 4
      ; mapped_data_8._0_4_ = (uint)mapped_data_8 + 1) {
    (**(code **)(lVar13 + 0x3b8))(1,&local_24);
    dVar11 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar11,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x10f9);
    (*this->m_pNamedBufferStorage)
              (local_24,4,&local_28,mapping_flags[(ulong)(uint)mapped_data_8 + 2]);
    dVar11 = (**(code **)(lVar13 + 0x800))();
    glu::checkError(dVar11,"glNamedBuffeStorage failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x10fc);
    pvVar15 = (*this->m_pMapNamedBufferRange)
                        (local_24,0,4,mapping_flags[(ulong)(uint)mapped_data_8 - 2]);
    bVar2 = ErrorCheckAndLog(this,"glMapNamedBufferRange",0x502,
                             *(GLchar **)(&i_1 + (ulong)(uint)mapped_data_8 * 2));
    bVar2 = buffer_special_flags._3_1_ && bVar2;
    if (pvVar15 != (void *)0x0) {
      (*this->m_pUnmapNamedBuffer)((GLuint)dummy_data);
      do {
        iVar10 = (**(code **)(lVar13 + 0x800))();
      } while (iVar10 != 0);
    }
    if (local_24 != 0) {
      (**(code **)(lVar13 + 0x438))(1,&local_24);
      local_24 = 0;
    }
  }
  if (dummy_data != (GLubyte  [4])0x0) {
    (**(code **)(lVar13 + 0x438))(1,dummy_data);
    dummy_data[0] = '\0';
    dummy_data[1] = '\0';
    dummy_data[2] = '\0';
    dummy_data[3] = '\0';
  }
  if (local_24 != 0) {
    (**(code **)(lVar13 + 0x438))(1,&local_24);
  }
  return buffer_special_flags._3_1_;
}

Assistant:

bool ErrorsTest::TestErrorsOfMapNamedBufferRange()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer				  = 0;
	glw::GLuint  buffer_special_flags = 0;
	glw::GLubyte dummy_data[4]		  = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data,
							  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pMapNamedBufferRange(not_a_buffer_name, 0, sizeof(dummy_data), GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test negative offset error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, -1, sizeof(dummy_data), GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_VALUE, " if offset is negative.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test negative length error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, -1, GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_VALUE, " if length is negative.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test length overflow error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data) * 2, GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_VALUE,
									  " if length is greater than the value of BUFFER_SIZE"
									  " for the buffer object, or if access has any bits set other"
									  " than those defined above.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test (offset+length) overflow error behavior. */
		{
			glw::GLvoid* mapped_data =
				m_pMapNamedBufferRange(buffer, sizeof(dummy_data) / 2, sizeof(dummy_data), GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_VALUE,
									  " if offset+length is greater than the value of BUFFER_SIZE"
									  " for the buffer object, or if access has any bits set other"
									  " than those defined above.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test zero length error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, 0, GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION, " if length is zero.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test mapping of mapped buffer error behavior. */
		{
			m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapNamedBuffer.");

			glw::GLvoid* subsequent_mapped_data =
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION,
									  " if the buffer object is in a mapped state.");

			m_pUnmapNamedBuffer(buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapNamedBuffer failed.");

			if (subsequent_mapped_data)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "glMapNamedBufferRange called on mapped buffer returned non-NULL pointer when error shall "
					   "occure."
					   "This may lead to undefined behavior during next tests (object still may be mapped). "
					   "Test was terminated prematurely."
					<< tcu::TestLog::EndMessage;
				throw 0;
			}
		}

		/* Test access flag read and write bits are not set error behavior. */
		{
			glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), 0);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION,
									  " if neither MAP_READ_BIT nor MAP_WRITE_BIT is set.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test read access invalid flags error behavior. */
		{
			glw::GLenum read_access_invalid_flags[] = { GL_MAP_INVALIDATE_RANGE_BIT, GL_MAP_INVALIDATE_BUFFER_BIT,
														GL_MAP_UNSYNCHRONIZED_BIT };
			const glw::GLchar* read_access_invalid_flags_log[] = {
				" if MAP_READ_BIT is set with MAP_INVALIDATE_RANGE_BIT.",
				" if MAP_READ_BIT is set with MAP_INVALIDATE_BUFFER_BIT.",
				" if MAP_READ_BIT is set with MAP_UNSYNCHRONIZED_BIT."
			};
			glw::GLuint read_access_invalid_flags_count =
				sizeof(read_access_invalid_flags) / sizeof(read_access_invalid_flags[0]);

			for (glw::GLuint i = 0; i < read_access_invalid_flags_count; ++i)
			{
				glw::GLvoid* mapped_data = m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data),
																  GL_MAP_READ_BIT | read_access_invalid_flags[i]);

				is_ok &=
					ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION, read_access_invalid_flags_log[i]);

				/* Sanity unmapping. */
				if (DE_NULL != mapped_data)
				{
					m_pUnmapNamedBuffer(buffer);
					while (gl.getError())
						;
				}
			}
		}

		/* Test access flush bit without write bit error behavior. */
		{
			glw::GLvoid* mapped_data =
				m_pMapNamedBufferRange(buffer, 0, sizeof(dummy_data), GL_MAP_READ_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);

			is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION,
									  " if MAP_FLUSH_EXPLICIT_BIT is set and MAP_WRITE_BIT is not set.");

			/* Sanity unmapping. */
			if (DE_NULL != mapped_data)
			{
				m_pUnmapNamedBuffer(buffer);
				while (gl.getError())
					;
			}
		}

		/* Test incompatible buffer flag error behavior. */
		{
			glw::GLenum buffer_flags[] = { GL_MAP_WRITE_BIT, GL_MAP_READ_BIT, GL_MAP_WRITE_BIT,
										   GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT };
			glw::GLenum mapping_flags[] = { GL_MAP_READ_BIT, GL_MAP_WRITE_BIT, GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT,
											GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT | GL_MAP_COHERENT_BIT };
			const glw::GLchar* mapping_flags_log[] = {
				" if MAP_READ_BIT is set, but the same bit is not included in the buffer's storage flags.",
				" if MAP_WRITE_BIT is set, but the same bit is not included in the buffer's storage flags.",
				" if MAP_PERSISTENT_BIT is set, but the same bit is not included in the buffer's storage flags.",
				" if MAP_COHERENT_BIT is set, but the same bit is not included in the buffer's storage flags."
			};
			glw::GLuint flags_count = sizeof(mapping_flags) / sizeof(mapping_flags[0]);

			for (glw::GLuint i = 0; i < flags_count; ++i)
			{
				/* Create buffer. */
				gl.createBuffers(1, &buffer_special_flags);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

				m_pNamedBufferStorage(buffer_special_flags, sizeof(dummy_data), &dummy_data, buffer_flags[i]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

				/* Test mapping. */
				glw::GLvoid* mapped_data =
					m_pMapNamedBufferRange(buffer_special_flags, 0, sizeof(dummy_data), mapping_flags[i]);

				is_ok &= ErrorCheckAndLog("glMapNamedBufferRange", GL_INVALID_OPERATION, mapping_flags_log[i]);

				/* Sanity unmapping. */
				if (DE_NULL != mapped_data)
				{
					m_pUnmapNamedBuffer(buffer);
					while (gl.getError())
						;
				}

				/* Releasing buffer. */
				if (buffer_special_flags)
				{
					gl.deleteBuffers(1, &buffer_special_flags);

					buffer_special_flags = 0;
				}
			}
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (buffer_special_flags)
	{
		gl.deleteBuffers(1, &buffer_special_flags);

		buffer_special_flags = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}